

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall
QMdi::ControlContainer::showButtonsInMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  Data *pDVar1;
  Data *pDVar2;
  QWidget *pQVar3;
  long lVar4;
  QWidget *pQVar5;
  
  if ((((menuBar != (QMenuBar *)0x0) && (pDVar1 = (this->mdiChild).wp.d, pDVar1 != (Data *)0x0)) &&
      (*(int *)(pDVar1 + 4) != 0)) &&
     (((this->mdiChild).wp.value != (QObject *)0x0 &&
      ((*(byte *)(*(long *)((this->mdiChild).wp.value + 0x20) + 0xd) & 8) == 0)))) {
    pDVar2 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)menuBar);
    pDVar1 = (this->m_menuBar).wp.d;
    (this->m_menuBar).wp.d = pDVar2;
    (this->m_menuBar).wp.value = (QObject *)menuBar;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    pDVar1 = (this->m_menuLabel).wp.d;
    if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
       (((this->m_menuLabel).wp.value != (QObject *)0x0 &&
        ((*(byte *)(*(long *)((this->mdiChild).wp.value + 0x20) + 0xd) & 0x20) != 0)))) {
      pQVar3 = QMenuBar::cornerWidget(menuBar,TopLeftCorner);
      if (pQVar3 != (QWidget *)0x0) {
        QWidget::hide(pQVar3);
      }
      pDVar1 = (this->m_menuLabel).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar5 = (QWidget *)0x0;
      }
      else {
        pQVar5 = (QWidget *)(this->m_menuLabel).wp.value;
      }
      if (pQVar5 != pQVar3) {
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QWidget *)0x0;
        }
        else {
          pQVar5 = (QWidget *)(this->m_menuLabel).wp.value;
        }
        QMenuBar::setCornerWidget(menuBar,pQVar5,TopLeftCorner);
        QPointer<QWidget>::operator=(&this->previousLeft,pQVar3);
      }
      QWidget::show((QWidget *)(this->m_menuLabel).wp.value);
    }
    lVar4 = QMetaObject::cast((QObject *)&ControllerWidget::staticMetaObject);
    if ((lVar4 != 0) && ((*(byte *)(lVar4 + 0x30) & 7) != 0)) {
      pQVar3 = QMenuBar::cornerWidget(menuBar,TopRightCorner);
      if (pQVar3 != (QWidget *)0x0) {
        QWidget::hide(pQVar3);
      }
      pDVar1 = (this->m_controllerWidget).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar5 = (QWidget *)0x0;
      }
      else {
        pQVar5 = (QWidget *)(this->m_controllerWidget).wp.value;
      }
      if (pQVar5 != pQVar3) {
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar5 = (QWidget *)0x0;
        }
        else {
          pQVar5 = (QWidget *)(this->m_controllerWidget).wp.value;
        }
        QMenuBar::setCornerWidget(menuBar,pQVar5,TopRightCorner);
        QPointer<QWidget>::operator=(&this->previousRight,pQVar3);
      }
      QWidget::show((QWidget *)(this->m_controllerWidget).wp.value);
    }
    QMdiSubWindowPrivate::setNewWindowTitle
              (*(QMdiSubWindowPrivate **)((this->mdiChild).wp.value + 8));
    return;
  }
  return;
}

Assistant:

void ControlContainer::showButtonsInMenuBar(QMenuBar *menuBar)
{
    if (!menuBar || !mdiChild || mdiChild->windowFlags() & Qt::FramelessWindowHint)
        return;
    m_menuBar = menuBar;

    if (m_menuLabel && mdiChild->windowFlags() & Qt::WindowSystemMenuHint) {
        QWidget *currentLeft = menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft)
            currentLeft->hide();
        if (currentLeft != m_menuLabel) {
            menuBar->setCornerWidget(m_menuLabel, Qt::TopLeftCorner);
            previousLeft = currentLeft;
        }
        m_menuLabel->show();
    }
    ControllerWidget *controllerWidget = qobject_cast<ControllerWidget *>(m_controllerWidget);
    if (controllerWidget && controllerWidget->hasVisibleControls()) {
        QWidget *currentRight = menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight)
            currentRight->hide();
        if (currentRight != m_controllerWidget) {
            menuBar->setCornerWidget(m_controllerWidget, Qt::TopRightCorner);
            previousRight = currentRight;
        }
        m_controllerWidget->show();
    }
    mdiChild->d_func()->setNewWindowTitle();
}